

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FrontLoadedReporterFactory.cpp
# Opt level: O1

shared_ptr<ApprovalTests::Reporter>
ApprovalTests::FrontLoadedReporterFactory::getFrontLoadedReporter(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<ApprovalTests::Reporter> sVar2;
  
  frontLoadedReporter();
  in_RDI->_vptr_Reporter =
       (_func_int **)
       frontLoadedReporter::reporter.
       super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var1 = frontLoadedReporter::reporter.
          super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  in_RDI[1]._vptr_Reporter =
       (_func_int **)
       frontLoadedReporter::reporter.
       super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
    }
  }
  sVar2.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<ApprovalTests::Reporter>)
         sVar2.super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Reporter> FrontLoadedReporterFactory::getFrontLoadedReporter()
    {
        return frontLoadedReporter();
    }